

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvalidExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
          (BumpAllocator *this,Expression **args,Type *args_1)

{
  InvalidExpression *pIVar1;
  size_t in_RDX;
  Type *in_RSI;
  Expression *in_RDI;
  InvalidExpression *unaff_retaddr;
  
  pIVar1 = (InvalidExpression *)allocate((BumpAllocator *)in_RDI,(size_t)in_RSI,in_RDX);
  ast::InvalidExpression::InvalidExpression(unaff_retaddr,in_RDI,in_RSI);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }